

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O3

LongLong __thiscall
cmsys::SystemInformationImplementation::GetProcMemoryAvailable
          (SystemInformationImplementation *this,char *hostLimitEnvVarName,char *procLimitEnvVarName
          )

{
  int iVar1;
  long lVar2;
  char *__nptr;
  longlong lVar3;
  rlim64_t rVar4;
  ResourceLimitType rlim;
  rlimit64 local_20;
  
  lVar2 = GetHostMemoryAvailable(this,hostLimitEnvVarName);
  if (procLimitEnvVarName != (char *)0x0) {
    __nptr = getenv(procLimitEnvVarName);
    if (__nptr != (char *)0x0) {
      lVar3 = atoll(__nptr);
      if ((0 < lVar3) && (lVar3 < lVar2)) {
        lVar2 = lVar3;
      }
    }
  }
  iVar1 = getrlimit64(RLIMIT_DATA,&local_20);
  if (local_20.rlim_cur != 0xffffffffffffffff && iVar1 == 0) {
    rVar4 = local_20.rlim_cur + 0x3ff;
    if (-1 < (long)local_20.rlim_cur) {
      rVar4 = local_20.rlim_cur;
    }
    if ((long)rVar4 >> 10 < lVar2) {
      lVar2 = (long)rVar4 >> 10;
    }
  }
  iVar1 = getrlimit64(RLIMIT_AS,&local_20);
  if (local_20.rlim_cur != 0xffffffffffffffff && iVar1 == 0) {
    rVar4 = local_20.rlim_cur + 0x3ff;
    if (-1 < (long)local_20.rlim_cur) {
      rVar4 = local_20.rlim_cur;
    }
    if ((long)rVar4 >> 10 < lVar2) {
      lVar2 = (long)rVar4 >> 10;
    }
  }
  return lVar2;
}

Assistant:

SystemInformation::LongLong
SystemInformationImplementation::GetProcMemoryAvailable(
        const char *hostLimitEnvVarName,
        const char *procLimitEnvVarName)
{
  SystemInformation::LongLong memAvail
    = this->GetHostMemoryAvailable(hostLimitEnvVarName);

  // the following mechanism is provide for systems where rlimits
  // are not employed. Units are in KiB.
  if (procLimitEnvVarName)
    {
    const char *procLimitEnvVarValue=getenv(procLimitEnvVarName);
    if (procLimitEnvVarValue)
      {
      SystemInformation::LongLong procLimit=atoLongLong(procLimitEnvVarValue);
      if (procLimit>0)
        {
        memAvail=min(procLimit,memAvail);
        }
      }
    }

#if defined(__linux)
  int ierr;
  ResourceLimitType rlim;
  ierr=GetResourceLimit(RLIMIT_DATA,&rlim);
  if ((ierr==0) && (rlim.rlim_cur != RLIM_INFINITY))
    {
    memAvail=min((SystemInformation::LongLong)rlim.rlim_cur/1024,memAvail);
    }

  ierr=GetResourceLimit(RLIMIT_AS,&rlim);
  if ((ierr==0) && (rlim.rlim_cur != RLIM_INFINITY))
    {
    memAvail=min((SystemInformation::LongLong)rlim.rlim_cur/1024,memAvail);
    }
#elif defined(__APPLE__)
  struct rlimit rlim;
  int ierr;
  ierr=getrlimit(RLIMIT_DATA,&rlim);
  if ((ierr==0) && (rlim.rlim_cur != RLIM_INFINITY))
    {
    memAvail=min((SystemInformation::LongLong)rlim.rlim_cur/1024,memAvail);
    }

  ierr=getrlimit(RLIMIT_RSS,&rlim);
  if ((ierr==0) && (rlim.rlim_cur != RLIM_INFINITY))
    {
    memAvail=min((SystemInformation::LongLong)rlim.rlim_cur/1024,memAvail);
    }
#endif

  return memAvail;
}